

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void __thiscall
glcts::anon_unknown_0::UniformValue::streamValue
          (UniformValue *this,ostringstream *str,int arrayElement,int column)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pair<int,_int> pVar4;
  pointer pfVar5;
  pointer piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  pVar4 = (this->type).size;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (&str->super_basic_ostream<char,_std::char_traits<char>_>,
                      (this->type).refStrType._M_dataplus._M_p,
                      (this->type).refStrType._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  if ((this->type).baseType == 0x82e6) {
    lVar9 = 0;
    do {
      if (lVar9 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&str->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
      }
      std::ostream::_M_insert<double>
                ((double)(this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[(arrayElement << 2) + lVar9]);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
  }
  else {
    iVar7 = pVar4.second * pVar4.first;
    pfVar5 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVar4 = (this->type).size;
    iVar2 = pVar4.first;
    if (0 < iVar2 &&
        (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar5) {
      iVar8 = 0;
      do {
        iVar2 = pVar4.first;
        if (iVar8 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&str->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          pfVar5 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = (this->type).size.first;
        }
        poVar3 = std::ostream::_M_insert<double>
                           ((double)pfVar5[iVar2 * column + iVar7 * arrayElement + iVar8]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,".0",2);
        pfVar5 = (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pVar4 = (this->type).size;
        iVar2 = pVar4.first;
      } while (((this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish != pfVar5) && (iVar8 = iVar8 + 1, iVar8 < iVar2));
    }
    piVar6 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < iVar2 &&
        (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar6) {
      iVar8 = iVar7 * arrayElement;
      lVar9 = 1;
      do {
        if (lVar9 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&str->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          piVar6 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        std::ostream::operator<<(str,piVar6[iVar8]);
        piVar6 = (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = (this->type).size.first;
        if ((this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish == piVar6) break;
        iVar8 = iVar8 + 1;
        bVar1 = lVar9 < iVar2;
        lVar9 = lVar9 + 1;
      } while (bVar1);
    }
    piVar6 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish != piVar6) && (0 < iVar2)) {
      iVar7 = iVar7 * arrayElement;
      lVar9 = 1;
      do {
        if (lVar9 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&str->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          piVar6 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        poVar3 = (ostream *)std::ostream::operator<<(str,piVar6[iVar7]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"u",1);
        piVar6 = (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish == piVar6) break;
        iVar7 = iVar7 + 1;
        bVar1 = lVar9 < (this->type).size.first;
        lVar9 = lVar9 + 1;
      } while (bVar1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&str->super_basic_ostream<char,_std::char_traits<char>_>,")",1);
  return;
}

Assistant:

void streamValue(std::ostringstream& str, int arrayElement = 0, int column = 0) const
	{
		int arrayElementSize = type.getSize().first * type.getSize().second;

		str << type.refStr() << "(";

		if (type.getBaseType() == GL_SAMPLER)
		{
			for (size_t elem = 0; elem < 4; elem++)
			{
				if (elem)
					str << ", ";
				str << fValues[arrayElement * 4 + elem];
			}
			str << ")";
			return;
		}

		for (int elem = 0; fValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << fValues[arrayElement * arrayElementSize + column * type.getSize().first + elem] << ".0";
		}
		for (int elem = 0; iValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << iValues[arrayElement * arrayElementSize + elem];
		}
		for (int elem = 0; uValues.size() && elem < type.getSize().first; elem++)
		{
			if (elem)
				str << ", ";
			str << uValues[arrayElement * arrayElementSize + elem] << "u";
		}
		str << ")";
	}